

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

void __thiscall FWeaponSlots::SendDifferences(FWeaponSlots *this,int playernum,FWeaponSlots *other)

{
  int iVar1;
  int iVar2;
  PClassWeapon *pPVar3;
  PClassWeapon *pPVar4;
  int local_28;
  int local_24;
  int j;
  int i;
  FWeaponSlots *other_local;
  int playernum_local;
  FWeaponSlots *this_local;
  
  local_24 = 0;
  do {
    if (9 < local_24) {
      return;
    }
    iVar1 = FWeaponSlot::Size(other->Slots + local_24);
    iVar2 = FWeaponSlot::Size(this->Slots + local_24);
    if (iVar1 == iVar2) {
      local_28 = FWeaponSlot::Size(this->Slots + local_24);
      do {
        iVar1 = local_28 + -1;
        if (local_28 < 1) break;
        pPVar3 = FWeaponSlot::GetWeapon(other->Slots + local_24,iVar1);
        pPVar4 = FWeaponSlot::GetWeapon(this->Slots + local_24,iVar1);
        local_28 = iVar1;
      } while (pPVar3 == pPVar4);
      if (-1 < iVar1) goto LAB_007ff3e6;
    }
    else {
LAB_007ff3e6:
      if (playernum == consoleplayer) {
        Net_WriteByte('9');
      }
      else {
        Net_WriteByte('C');
        Net_WriteByte((BYTE)playernum);
      }
      Net_WriteByte((BYTE)local_24);
      iVar1 = FWeaponSlot::Size(this->Slots + local_24);
      Net_WriteByte((BYTE)iVar1);
      for (local_28 = 0; iVar1 = FWeaponSlot::Size(this->Slots + local_24), local_28 < iVar1;
          local_28 = local_28 + 1) {
        pPVar3 = FWeaponSlot::GetWeapon(this->Slots + local_24,local_28);
        Net_WriteWeapon(pPVar3);
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void FWeaponSlots::SendDifferences(int playernum, const FWeaponSlots &other)
{
	int i, j;

	for (i = 0; i < NUM_WEAPON_SLOTS; ++i)
	{
		if (other.Slots[i].Size() == Slots[i].Size())
		{
			for (j = (int)Slots[i].Size(); j-- > 0; )
			{
				if (other.Slots[i].GetWeapon(j) != Slots[i].GetWeapon(j))
				{
					break;
				}
			}
			if (j < 0)
			{ // The two slots are the same.
				continue;
			}
		}
		// The slots differ. Send mine.
		if (playernum == consoleplayer)
		{
			Net_WriteByte(DEM_SETSLOT);
		}
		else
		{
			Net_WriteByte(DEM_SETSLOTPNUM);
			Net_WriteByte(playernum);
		}
		Net_WriteByte(i);
		Net_WriteByte(Slots[i].Size());
		for (j = 0; j < Slots[i].Size(); ++j)
		{
			Net_WriteWeapon(Slots[i].GetWeapon(j));
		}
	}
}